

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall
asmjit::Assembler::_emitLog
          (Assembler *this,uint32_t instId,uint32_t options,Operand_ *o0,Operand_ *o1,Operand_ *o2,
          Operand_ *o3,uint32_t relSize,uint32_t imLen,uint8_t *afterCursor)

{
  uint32_t logOptions;
  Logger *pLVar1;
  size_t binLen;
  size_t dispLen;
  uint8_t *binData;
  size_t imLen_00;
  char *comment;
  Detail local_1c8;
  anon_union_16_7_ed616b9d_for_Operand__0 local_1b8;
  UInt64 local_1a8;
  anon_union_8_2_78723da6_for_MemData_2 aStack_1a0;
  UInt64 local_198;
  anon_union_8_2_78723da6_for_MemData_2 aStack_190;
  UInt64 local_188;
  anon_union_8_2_78723da6_for_MemData_2 aStack_180;
  undefined1 local_178 [32];
  StringBuilderTmp<256UL> sb;
  
  pLVar1 = ((this->super_CodeEmitter)._code)->_logger;
  if (pLVar1 == (Logger *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/assembler.cpp"
               ,0x172,"logger != nullptr");
  }
  if ((options & 4) != 0) {
    sb.super_StringBuilder._data = sb._embeddedData;
    sb._embeddedData[0] = '\0';
    sb.super_StringBuilder._length = 0;
    sb.super_StringBuilder._capacity = 0x100;
    sb.super_StringBuilder._canFree = 0;
    logOptions = pLVar1->_options;
    binLen = (long)afterCursor - (long)this->_bufferPtr;
    StringBuilder::_opString(&sb.super_StringBuilder,1,pLVar1->_indentation,0xffffffffffffffff);
    local_1b8._packed[0].field_10 = (o0->field_0)._packed[0];
    local_1b8._mem.field_2 = (o0->field_0)._mem.field_2;
    local_1a8 = (o1->field_0)._packed[0];
    aStack_1a0 = (o1->field_0)._mem.field_2;
    local_198 = (o2->field_0)._packed[0];
    aStack_190 = (o2->field_0)._mem.field_2;
    local_188 = (o3->field_0)._packed[0];
    aStack_180 = (o3->field_0)._mem.field_2;
    if ((options & 8) == 0) {
      local_178 = ZEXT832(0) << 0x20;
    }
    else {
      local_178._0_16_ = *(undefined1 (*) [16])&this->_op4;
      local_178._16_16_ = *(undefined1 (*) [16])&this->_op5;
    }
    local_1c8.extraReg = (this->super_CodeEmitter)._extraReg;
    local_1c8.instId = instId;
    local_1c8.options = options;
    Logging::formatInstruction
              (&sb.super_StringBuilder,logOptions,&this->super_CodeEmitter,
               (uint)(this->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._type,&local_1c8,
               (Operand_ *)&local_1b8._any,6);
    if ((logOptions & 1) == 0) {
      comment = (this->super_CodeEmitter)._inlineComment;
      binLen = 0xffffffffffffffff;
      binData = (uint8_t *)0x0;
      dispLen = 0;
      imLen_00 = 0;
    }
    else {
      comment = (this->super_CodeEmitter)._inlineComment;
      binData = this->_bufferPtr;
      dispLen = (size_t)relSize;
      imLen_00 = (size_t)imLen;
    }
    Logging::formatLine(&sb.super_StringBuilder,binData,binLen,dispLen,imLen_00,comment);
    (*pLVar1->_vptr_Logger[2])(pLVar1,sb.super_StringBuilder._data,sb.super_StringBuilder._length);
    StringBuilder::~StringBuilder(&sb.super_StringBuilder);
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/assembler.cpp"
             ,0x173,"options & CodeEmitter::kOptionLoggingEnabled");
}

Assistant:

void Assembler::_emitLog(
  uint32_t instId, uint32_t options, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3,
  uint32_t relSize, uint32_t imLen, uint8_t* afterCursor) {

  Logger* logger = _code->getLogger();
  ASMJIT_ASSERT(logger != nullptr);
  ASMJIT_ASSERT(options & CodeEmitter::kOptionLoggingEnabled);

  StringBuilderTmp<256> sb;
  uint32_t logOptions = logger->getOptions();

  uint8_t* beforeCursor = _bufferPtr;
  intptr_t emittedSize = (intptr_t)(afterCursor - beforeCursor);

  sb.appendString(logger->getIndentation());

  Operand_ opArray[6];
  opArray[0].copyFrom(o0);
  opArray[1].copyFrom(o1);
  opArray[2].copyFrom(o2);
  opArray[3].copyFrom(o3);

  if (options & kOptionOp4Op5Used) {
    opArray[4].copyFrom(_op4);
    opArray[5].copyFrom(_op5);
  }
  else {
    opArray[4].reset();
    opArray[5].reset();
  }

  Logging::formatInstruction(
    sb, logOptions,
    this, getArchType(),
    Inst::Detail(instId, options, _extraReg), opArray, 6);

  if ((logOptions & Logger::kOptionBinaryForm) != 0)
    Logging::formatLine(sb, _bufferPtr, emittedSize, relSize, imLen, getInlineComment());
  else
    Logging::formatLine(sb, nullptr, Globals::kInvalidIndex, 0, 0, getInlineComment());

  logger->log(sb.getData(), sb.getLength());
}